

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

TPZMatrix<std::complex<double>_> * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::Create(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
         *this)

{
  TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  *this_local;
  
  return (TPZMatrix<std::complex<double>_> *)0x0;
}

Assistant:

TPZMatrix<TVar> *TPZFrontStructMatrix<TFront,TVar,TPar>::Create(){
	
    /* TPZVec <int> numelconnected(fMesh->NEquations(),0);
	 // TPZFrontMatrix<TPZStackEqnStorage, TPZFrontNonSym> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TPZFrontNonSym>(fMesh->NEquations());
	 
     GetNumElConnected(numelconnected);
     //mat->SetNumElConnected(numelconnected);
     return mat;
     */
	return nullptr;
}